

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O1

void cfgfile::string_trait_t::fill_buf
               (istream_t *stream,buf_t *buf,pos_t buf_size,pos_t *pos,pos_t size)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  size_type __n;
  pointer pcVar5;
  allocator_type local_42;
  value_type_conflict local_41;
  vector<char,_std::allocator<char>_> local_40;
  
  __n = size - *pos;
  if (buf_size <= size - *pos) {
    __n = buf_size;
  }
  local_41 = '\0';
  std::vector<char,_std::allocator<char>_>::vector(&local_40,__n,&local_41,&local_42);
  std::vector<char,_std::allocator<char>_>::_M_move_assign(buf,&local_40);
  if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pcVar1 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pcVar1) {
    std::istream::read((char *)stream,(long)pcVar1);
  }
  pcVar1 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar5 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar2 = 0;
  lVar4 = (long)pcVar5 - (long)pcVar1;
  lVar3 = lVar2;
  if (lVar4 != 0) {
    do {
      lVar3 = lVar2;
      if (pcVar5[-1] != '\0') break;
      pcVar5 = pcVar5 + -1;
      lVar2 = lVar2 + 1;
      lVar3 = lVar4;
    } while (pcVar5 != pcVar1);
  }
  if (lVar3 != 0) {
    std::vector<char,_std::allocator<char>_>::resize(buf,__n - lVar3);
  }
  *pos = *pos + __n;
  return;
}

Assistant:

static inline void fill_buf( istream_t & stream, buf_t & buf, pos_t buf_size, pos_t & pos, pos_t size )
	{
		pos_t actual_size = ( size - pos < buf_size ? size - pos : buf_size );

		buf = buf_t( actual_size, 0x00 );

		if( buf.size() > 0 )
			stream.read( &buf[ 0 ], actual_size );

		std::size_t skip = 0;

		for( auto it = buf.crbegin(), last = buf.crend(); it != last; ++it )
		{
			if( *it == 0x00 )
				++skip;
			else
				break;
		}

		if( skip > 0 )
			buf.resize( actual_size - skip );

		pos += actual_size;
	}